

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfsbfs.cpp
# Opt level: O3

void bfs(int u,vector<int,_std::allocator<int>_> *distance,vector<int,_std::allocator<int>_> *path)

{
  ulong *puVar1;
  int *piVar2;
  ulong uVar3;
  pointer piVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int *piVar10;
  int to;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  int local_90;
  int local_8c;
  _Deque_base<int,_std::allocator<int>_> local_88;
  vector<int,_std::allocator<int>_> *local_38;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_8c = u;
  local_38 = distance;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_88,0);
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)&local_88,&local_8c);
    u = local_8c;
  }
  else {
    *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = u;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  iVar8 = u + 0x3f;
  if (-1 < u) {
    iVar8 = u;
  }
  puVar1 = (ulong *)((long)(iVar8 >> 6) * 8 + (anonymous_namespace)::usedbfs + -8 +
                    (ulong)(((long)u & 0x800000000000003fU) < 0x8000000000000001) * 8);
  *puVar1 = *puVar1 | 1L << ((byte)u & 0x3f);
  (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start[u]
       = -1;
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      iVar8 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first);
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_88._M_impl.super__Deque_impl_data._M_start._M_last =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80;
        local_88._M_impl.super__Deque_impl_data._M_start._M_first =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_88._M_impl.super__Deque_impl_data._M_start._M_node =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      piVar2 = edge.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar8].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      for (piVar10 = edge.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar8].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start; piVar10 != piVar2; piVar10 = piVar10 + 1) {
        local_90 = *piVar10;
        uVar7 = (ulong)local_90;
        iVar5 = local_90 + 0x3f;
        if (-1 < (long)uVar7) {
          iVar5 = local_90;
        }
        lVar6 = (long)(iVar5 >> 6) * 8 + (anonymous_namespace)::usedbfs;
        uVar9 = (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001);
        uVar3 = *(ulong *)(lVar6 + -8 + uVar9 * 8);
        if ((uVar3 >> (uVar7 & 0x3f) & 1) == 0) {
          *(ulong *)(lVar6 + uVar9 * 8 + -8) = uVar3 | 1L << ((byte)local_90 & 0x3f);
          if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                      ((deque<int,std::allocator<int>> *)&local_88,&local_90);
          }
          else {
            *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_90;
            local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
          piVar4 = (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          piVar4[local_90] = piVar4[iVar8] + 1;
          (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[local_90] = iVar8;
        }
      }
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_88);
  return;
}

Assistant:

void bfs(int u, vector<int> &distance, vector<int> &path) {
    queue<int> q;
    q.push(u);
    usedbfs[u] = true;
    path[u] = -1;
    while (!q.empty()) {
        int u = q.front();
        q.pop();
        for (int to : edge[u]) {
            if (!usedbfs[to]) {
                usedbfs[to] = true;
                q.push(to);
                distance[to] = distance[u] + 1;
                path[to] = u;
            }
        }
    }
}